

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_sse2.c
# Opt level: O1

void aom_highbd_quantize_b_sse2
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  uint *puVar2;
  short sVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ushort uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i zbins [2];
  uint local_98 [4];
  int local_88 [4];
  int local_78 [4];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58 [4];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  iVar15 = (int)count;
  iVar5 = iVar15 + 3;
  if (-1 < iVar15) {
    iVar5 = iVar15;
  }
  uVar6 = iVar5 >> 2;
  auVar17 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  local_78[0] = auVar17._0_4_ >> 0x10;
  local_78[1] = auVar17._4_4_ >> 0x10;
  local_58[0] = -local_78[0];
  local_58[1] = -local_78[1];
  local_58[2] = -local_78[1];
  local_58[3] = -local_78[1];
  local_48 = -local_78[1];
  iStack_44 = -local_78[1];
  iStack_40 = -local_78[1];
  iStack_3c = -local_78[1];
  local_78[2] = local_78[1];
  local_78[3] = local_78[1];
  local_68 = local_78[1];
  iStack_64 = local_78[1];
  iStack_60 = local_78[1];
  iStack_5c = local_78[1];
  memset(qcoeff_ptr,0,count * 4);
  memset(dqcoeff_ptr,0,count * 4);
  uVar12 = iVar5 >> 0x1f & uVar6;
  uVar14 = uVar6 * 4;
  uVar7 = uVar6;
  do {
    uVar7 = uVar7 - 1;
    uVar14 = uVar14 - 4;
    if ((int)uVar6 < 1) goto LAB_0031c73e;
    piVar1 = coeff_ptr + uVar14;
    uVar11 = (ulong)(uVar7 != 0);
    auVar18._0_4_ = -(uint)(*piVar1 < local_78[uVar11 * 4]);
    auVar18._4_4_ = -(uint)(piVar1[1] < local_78[uVar11 * 4 + 1]);
    auVar18._8_4_ = -(uint)(piVar1[2] < local_78[uVar11 * 4 + 2]);
    auVar18._12_4_ = -(uint)(piVar1[3] < local_78[uVar11 * 4 + 3]);
    auVar17._0_4_ = -(uint)(local_58[uVar11 * 4] < *piVar1);
    auVar17._4_4_ = -(uint)(local_58[uVar11 * 4 + 1] < piVar1[1]);
    auVar17._8_4_ = -(uint)(local_58[uVar11 * 4 + 2] < piVar1[2]);
    auVar17._12_4_ = -(uint)(local_58[uVar11 * 4 + 3] < piVar1[3]);
    auVar17 = auVar17 & auVar18;
    uVar9 = ((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
            (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) ^ 0xffff;
    uVar6 = uVar6 - 1;
  } while (uVar9 == 0);
  uVar12 = (uVar6 - (uVar9 == 0)) + 1;
LAB_0031c73e:
  if ((int)uVar12 < 1) {
    uVar4 = 0;
  }
  else {
    sVar3 = -1;
    lVar10 = 0;
    uVar11 = 0;
    do {
      puVar2 = (uint *)(coeff_ptr + uVar11 * 4);
      local_98[0] = (int)*puVar2 >> 0x1f;
      local_98[1] = (int)puVar2[1] >> 0x1f;
      local_98[2] = (int)puVar2[2] >> 0x1f;
      local_98[3] = (int)puVar2[3] >> 0x1f;
      local_88[0] = (*puVar2 ^ local_98[0]) - local_98[0];
      local_88[1] = (puVar2[1] ^ local_98[1]) - local_98[1];
      local_88[2] = (puVar2[2] ^ local_98[2]) - local_98[2];
      local_88[3] = (puVar2[3] ^ local_98[3]) - local_98[3];
      uVar16 = (ulong)(uVar11 != 0);
      auVar19._0_4_ = -(uint)(local_88[0] < local_78[uVar16 * 4]);
      auVar19._4_4_ = -(uint)(local_88[1] < local_78[uVar16 * 4 + 1]);
      auVar19._8_4_ = -(uint)(local_88[2] < local_78[uVar16 * 4 + 2]);
      auVar19._12_4_ = -(uint)(local_88[3] < local_78[uVar16 * 4 + 3]);
      lVar13 = 0;
      uVar14 = 0;
      do {
        if ((((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                       (ushort)((byte)(auVar19._12_4_ >> 7) & 1) << 0xc |
                       (ushort)((byte)(auVar19._12_4_ >> 0xf) & 1) << 0xd |
                       (ushort)((byte)(auVar19._12_4_ >> 0x17) & 1) << 0xe |
                      (ushort)(byte)(auVar19._12_4_ >> 0x1f) << 0xf) ^ 0xffff) >> (uVar14 & 0x1f) &
            1) != 0) {
          uVar16 = (ulong)((uint)(lVar10 != lVar13) * 2);
          lVar8 = (long)*(short *)((long)round_ptr + uVar16) +
                  (long)*(int *)((long)local_88 + lVar13 * 2);
          uVar7 = *(uint *)((long)local_98 + lVar13 * 2);
          uVar6 = (uint)((long)*(short *)((long)quant_shift_ptr + uVar16) *
                         (((ulong)(*(short *)((long)quant_ptr + uVar16) * lVar8) >> 0x10) + lVar8)
                        >> 0x10);
          iVar15 = (uVar7 ^ uVar6) - uVar7;
          *(int *)((long)qcoeff_ptr + lVar13 * 2) = iVar15;
          *(int *)((long)dqcoeff_ptr + lVar13 * 2) = *(short *)((long)dequant_ptr + uVar16) * iVar15
          ;
          if (uVar6 != 0) {
            if (sVar3 <= *(short *)((long)iscan + lVar13)) {
              sVar3 = *(short *)((long)iscan + lVar13);
            }
          }
        }
        uVar14 = uVar14 + 4;
        lVar13 = lVar13 + 2;
      } while (lVar13 != 8);
      uVar11 = uVar11 + 1;
      iscan = iscan + 4;
      dqcoeff_ptr = dqcoeff_ptr + 4;
      qcoeff_ptr = qcoeff_ptr + 4;
      lVar10 = lVar10 + -8;
    } while (uVar11 != uVar12);
    uVar4 = sVar3 + 1;
  }
  *eob_ptr = uVar4;
  return;
}

Assistant:

void aom_highbd_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t count,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  int i, j, non_zero_regs = (int)count / 4, eob_i = -1;
  __m128i zbins[2];
  __m128i nzbins[2];

  zbins[0] = _mm_set_epi32((int)zbin_ptr[1], (int)zbin_ptr[1], (int)zbin_ptr[1],
                           (int)zbin_ptr[0]);
  zbins[1] = _mm_set1_epi32((int)zbin_ptr[1]);

  nzbins[0] = _mm_setzero_si128();
  nzbins[1] = _mm_setzero_si128();
  nzbins[0] = _mm_sub_epi32(nzbins[0], zbins[0]);
  nzbins[1] = _mm_sub_epi32(nzbins[1], zbins[1]);

  (void)scan;

  memset(qcoeff_ptr, 0, count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, count * sizeof(*dqcoeff_ptr));

  // Pre-scan pass
  for (i = ((int)count / 4) - 1; i >= 0; i--) {
    __m128i coeffs, cmp1, cmp2;
    int test;
    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    cmp1 = _mm_cmplt_epi32(coeffs, zbins[i != 0]);
    cmp2 = _mm_cmpgt_epi32(coeffs, nzbins[i != 0]);
    cmp1 = _mm_and_si128(cmp1, cmp2);
    test = _mm_movemask_epi8(cmp1);
    if (test == 0xffff)
      non_zero_regs--;
    else
      break;
  }

  // Quantization pass:
  for (i = 0; i < non_zero_regs; i++) {
    __m128i coeffs, coeffs_sign, tmp1, tmp2;
    int test;
    int abs_coeff[4];
    int coeff_sign[4];

    coeffs = _mm_load_si128((const __m128i *)(coeff_ptr + i * 4));
    coeffs_sign = _mm_srai_epi32(coeffs, 31);
    coeffs = _mm_sub_epi32(_mm_xor_si128(coeffs, coeffs_sign), coeffs_sign);
    tmp1 = _mm_cmpgt_epi32(coeffs, zbins[i != 0]);
    tmp2 = _mm_cmpeq_epi32(coeffs, zbins[i != 0]);
    tmp1 = _mm_or_si128(tmp1, tmp2);
    test = _mm_movemask_epi8(tmp1);
    _mm_storeu_si128((__m128i *)abs_coeff, coeffs);
    _mm_storeu_si128((__m128i *)coeff_sign, coeffs_sign);

    for (j = 0; j < 4; j++) {
      if (test & (1 << (4 * j))) {
        int k = 4 * i + j;
        const int64_t tmp3 = abs_coeff[j] + round_ptr[k != 0];
        const int64_t tmp4 = ((tmp3 * quant_ptr[k != 0]) >> 16) + tmp3;
        const uint32_t abs_qcoeff =
            (uint32_t)((tmp4 * quant_shift_ptr[k != 0]) >> 16);
        qcoeff_ptr[k] =
            (int)(abs_qcoeff ^ (uint32_t)coeff_sign[j]) - coeff_sign[j];
        dqcoeff_ptr[k] = qcoeff_ptr[k] * dequant_ptr[k != 0];
        if (abs_qcoeff) eob_i = iscan[k] > eob_i ? iscan[k] : eob_i;
      }
    }
  }
  *eob_ptr = eob_i + 1;
}